

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Ses_ManFindNetworkExactCEGAR(Ses_Man_t *pSes,int nGates,char **pSol)

{
  word *__s;
  byte bVar1;
  int iVar2;
  ulong uVar3;
  word *pwVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  word *pwVar9;
  char *pcVar10;
  word *pwVar11;
  ulong in_R8;
  ulong uVar12;
  ulong uVar13;
  byte *pbVar14;
  long lVar15;
  uint uVar16;
  bool bVar17;
  word pTruth [4];
  
  uVar16 = (uint)(10 < nGates);
  Abc_DebugErase(pSes->nDebugOffset + uVar16 + 4,pSes->fVeryVerbose);
  Abc_DebugPrintIntInt((char *)(ulong)(uint)nGates,pSes->nMaxGates,pSes->fVeryVerbose,uVar16);
  uVar16 = pSes->nMaxDepth;
  if (nGates < 1 << ((byte)uVar16 & 0x1f) || uVar16 == 0xffffffff) {
    if (((uVar16 == 0xffffffff) || (pSes->pArrTimeProfile == (int *)0x0)) ||
       (nGates <= pSes->nMaxGates)) {
      if ((pSes->fDecStructure == 0) || (nGates <= 1 << ((byte)uVar16 - 1 & 0x1f))) {
        if (1 << ((byte)pSes->nSpecVars & 0x1f) <= nGates) {
          if (pSes->fReasonVerbose == 0) {
            return 3;
          }
          printf("give up due to impossible number of gates");
          return 3;
        }
        for (iVar7 = 0; iVar7 < pSes->nRandRowAssigns; iVar7 = iVar7 + 1) {
          iVar2 = rand();
          lVar15 = (long)iVar2 % (long)pSes->nRows;
          pSes->pTtValues[(int)lVar15 >> 6] =
               pSes->pTtValues[(int)lVar15 >> 6] | 1L << ((byte)lVar15 & 0x3f);
        }
        iVar7 = Ses_ManFindNetworkExact(pSes,nGates);
        if (iVar7 != 1) {
          return iVar7;
        }
        __s = pSes->pTtObjs;
        uVar8 = 0;
        while( true ) {
          pcVar10 = Ses_ManExtractSolution(pSes);
          *pSol = pcVar10;
          if (pcVar10[1] != '\x01') {
            __assert_fail("pSol[ABC_EXACT_SOL_NFUNC] == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0x404,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
          }
          uVar16 = (uint)pcVar10[2];
          pbVar14 = (byte *)(pcVar10 + 3);
          memset(__s,0,(long)(int)uVar16 << 5);
          uVar3 = 0;
          if (0 < (int)uVar16) {
            uVar3 = (ulong)uVar16;
          }
          pwVar9 = (word *)0x0;
          pwVar4 = __s;
          for (uVar6 = 0; iVar7 = (int)in_R8, uVar6 != uVar3; uVar6 = uVar6 + 1) {
            if (pbVar14[1] != 2) {
              __assert_fail("*p++ == 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                            ,0x40d,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
            }
            iVar2 = (int)(char)pbVar14[2];
            iVar7 = pSes->nSpecVars;
            if (iVar2 < iVar7) {
              pwVar9 = s_Truths8 + (long)iVar2 * 4;
            }
            else {
              pwVar9 = __s + (iVar2 - iVar7) * 4;
            }
            iVar2 = (int)(char)pbVar14[3];
            if (iVar2 < iVar7) {
              pwVar11 = s_Truths8 + (long)iVar2 * 4;
            }
            else {
              pwVar11 = __s + (iVar2 - iVar7) * 4;
            }
            bVar1 = *pbVar14;
            in_R8 = (ulong)bVar1;
            if ((bVar1 & 1) != 0) {
              uVar12 = (ulong)(uint)pSes->nSpecWords;
              if (pSes->nSpecWords < 1) {
                uVar12 = uVar8;
              }
              for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
                pwVar4[uVar13] = pwVar4[uVar13] | ~pwVar9[uVar13] & pwVar11[uVar13];
              }
            }
            if ((bVar1 & 2) != 0) {
              uVar12 = (ulong)(uint)pSes->nSpecWords;
              if (pSes->nSpecWords < 1) {
                uVar12 = uVar8;
              }
              for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
                pwVar4[uVar13] = pwVar4[uVar13] | ~pwVar11[uVar13] & pwVar9[uVar13];
              }
            }
            if ((bVar1 & 4) != 0) {
              in_R8 = (ulong)(uint)pSes->nSpecWords;
              if (pSes->nSpecWords < 1) {
                in_R8 = uVar8;
              }
              for (uVar12 = 0; in_R8 != uVar12; uVar12 = uVar12 + 1) {
                pwVar4[uVar12] = pwVar4[uVar12] | pwVar11[uVar12] & pwVar9[uVar12];
              }
            }
            pbVar14 = pbVar14 + 4;
            pwVar9 = __s + uVar6 * 4;
            pwVar4 = pwVar4 + 4;
          }
          iVar2 = Abc_Lit2Var((int)(char)*pbVar14);
          if (iVar2 != uVar16 - 1) {
            __assert_fail("Abc_Lit2Var( *p ) == nGates - 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0x421,"word *Ses_ManDeriveTruth(Ses_Man_t *, char *, int)");
          }
          pwVar4 = pTruth;
          Abc_TtXor(pwVar4,pwVar9,pSes->pSpec,pSes->nSpecWords,iVar7);
          iVar7 = pSes->nSpecVars;
          in_R8 = 1;
          bVar1 = (char)iVar7 - 6U & 0x1f;
          uVar3 = (ulong)(uint)(1 << bVar1);
          if (1 << bVar1 < 1) {
            uVar3 = uVar8;
          }
          if (iVar7 < 7) {
            uVar3 = 1;
          }
          uVar6 = 0;
          while( true ) {
            if (uVar3 * 0x40 + uVar6 == 0) {
              return 1;
            }
            uVar12 = *pwVar4;
            if (uVar12 != 0) break;
            uVar6 = uVar6 - 0x40;
            pwVar4 = pwVar4 + 1;
          }
          bVar17 = (int)uVar12 == 0;
          uVar3 = uVar12 >> 0x20;
          if (!bVar17) {
            uVar3 = uVar12;
          }
          iVar5 = (uint)bVar17 * 0x20;
          iVar2 = iVar5 + 0x10;
          uVar12 = uVar3 >> 0x10;
          if ((short)uVar3 != 0) {
            iVar2 = iVar5;
            uVar12 = uVar3;
          }
          iVar5 = iVar2 + 8;
          uVar3 = uVar12 >> 8;
          if ((char)uVar12 != '\0') {
            iVar5 = iVar2;
            uVar3 = uVar12;
          }
          iVar2 = iVar5 + 4;
          uVar12 = uVar3 >> 4;
          if ((uVar3 & 0xf) != 0) {
            iVar2 = iVar5;
            uVar12 = uVar3;
          }
          uVar16 = (uint)(uVar12 >> 2) & 0x3fffffff;
          iVar5 = iVar2 + 2;
          if ((uVar12 & 3) != 0) {
            uVar16 = (uint)uVar12;
            iVar5 = iVar2;
          }
          if (((uVar16 & 1) - iVar5) + (int)uVar6 == 2) break;
          uVar16 = iVar5 + (uVar16 & 1 ^ 1);
          if ((iVar7 < 6) && (pSes->nRows < (int)(uVar16 - (int)uVar6))) {
            return 1;
          }
          if (*pSol != (char *)0x0) {
            free(*pSol);
            *pSol = (char *)0x0;
          }
          lVar15 = ~uVar6 + (ulong)uVar16;
          iVar7 = (int)lVar15;
          if (pSes->fKeepRowAssigns != 0) {
            pSes->pTtValues[iVar7 >> 6] = pSes->pTtValues[iVar7 >> 6] | 1L << ((byte)lVar15 & 0x3f);
          }
          iVar7 = Ses_ManCreateTruthTableClause(pSes,iVar7);
          if (iVar7 == 0) {
            return 2;
          }
          iVar7 = Ses_ManSolve(pSes);
          if (iVar7 != 1) {
            return (uint)(iVar7 != 2) * 2;
          }
        }
        return 1;
      }
      if (pSes->fReasonVerbose == 0) {
        return 3;
      }
      pcVar10 = "give up due to impossible depth in AND-dec structure (depth = %d, gates = %d)";
    }
    else {
      if (pSes->fReasonVerbose == 0) {
        return 3;
      }
      pcVar10 = "give up due to impossible depth and arrival times (depth = %d, gates = %d)";
    }
  }
  else {
    if (pSes->fReasonVerbose == 0) {
      return 3;
    }
    pcVar10 = "give up due to impossible depth (depth = %d, gates = %d)";
  }
  printf(pcVar10,(ulong)uVar16,(ulong)(uint)nGates);
  return 3;
}

Assistant:

static int Ses_ManFindNetworkExactCEGAR( Ses_Man_t * pSes, int nGates, char ** pSol )
{
    int fRes, iMint, fSat, i;
    word pTruth[4];

    /* debug */
    Abc_DebugErase( pSes->nDebugOffset + ( nGates > 10 ? 5 : 4 ), pSes->fVeryVerbose );
    Abc_DebugPrintIntInt( " (%d/%d)", nGates, pSes->nMaxGates, pSes->fVeryVerbose );

    /* do #gates and max depth allow for a network? */
    if ( !Ses_CheckGatesConsistency( pSes, nGates ) )
        return 3;

    for ( i = 0; i < pSes->nRandRowAssigns; ++i )
        Abc_TtSetBit( pSes->pTtValues, rand() % pSes->nRows );

    fRes = Ses_ManFindNetworkExact( pSes, nGates );
    if ( fRes != 1 ) return fRes;

    while ( true )
    {
        *pSol = Ses_ManExtractSolution( pSes );
        Abc_TtXor( pTruth, Ses_ManDeriveTruth( pSes, *pSol, 0 ), pSes->pSpec, pSes->nSpecWords, 0 );
        iMint = Abc_TtFindFirstBit( pTruth, pSes->nSpecVars );

        if ( iMint == -1 || (pSes->nSpecVars < 6 && iMint > pSes->nRows) )
        {
            assert( fRes == 1 );
            return 1;
        }
        ABC_FREE( *pSol );

        if ( pSes->fKeepRowAssigns )
            Abc_TtSetBit( pSes->pTtValues, iMint - 1 );
        if ( !Ses_ManCreateTruthTableClause( pSes, iMint - 1 ) ) /* UNSAT, continue */
            return 2;

        if ( ( fSat = Ses_ManSolve( pSes ) ) == 1 ) continue;

        return ( fSat == 2 ) ? 0 : 2;
    }
}